

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSSBOLayoutCase.cpp
# Opt level: O2

void deqp::gles31::bb::anon_unknown_11::unmapBuffers
               (Functions *gl,
               vector<deqp::gles31::bb::(anonymous_namespace)::Buffer,_std::allocator<deqp::gles31::bb::(anonymous_namespace)::Buffer>_>
               *buffers)

{
  pointer pBVar1;
  GLenum err;
  int ndx;
  long lVar2;
  
  lVar2 = 0;
  while( true ) {
    pBVar1 = (buffers->
             super__Vector_base<deqp::gles31::bb::(anonymous_namespace)::Buffer,_std::allocator<deqp::gles31::bb::(anonymous_namespace)::Buffer>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if ((int)((ulong)((long)(buffers->
                            super__Vector_base<deqp::gles31::bb::(anonymous_namespace)::Buffer,_std::allocator<deqp::gles31::bb::(anonymous_namespace)::Buffer>_>
                            )._M_impl.super__Vector_impl_data._M_finish - (long)pBVar1) >> 3) <=
        lVar2) break;
    if (0 < pBVar1[lVar2].size) {
      (*gl->bindBuffer)(0x90d2,pBVar1[lVar2].buffer);
      (*gl->unmapBuffer)(0x90d2);
    }
    lVar2 = lVar2 + 1;
  }
  err = (*gl->getError)();
  glu::checkError(err,"Failed to unmap buffer",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fSSBOLayoutCase.cpp"
                  ,0x7e9);
  return;
}

Assistant:

void unmapBuffers (const glw::Functions& gl, const vector<Buffer>& buffers)
{
	for (int ndx = 0; ndx < (int)buffers.size(); ndx++)
	{
		if (buffers[ndx].size > 0)
		{
			gl.bindBuffer(GL_SHADER_STORAGE_BUFFER, buffers[ndx].buffer);
			gl.unmapBuffer(GL_SHADER_STORAGE_BUFFER);
		}
	}

	GLU_EXPECT_NO_ERROR(gl.getError(), "Failed to unmap buffer");
}